

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::strip_enclosed_expression(CompilerGLSL *this,string *expr)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  reference pcVar4;
  reference pcVar5;
  long lVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  undefined8 local_48;
  reference local_40;
  char *c;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  uint32_t paren_count;
  string *expr_local;
  CompilerGLSL *this_local;
  
  uVar2 = ::std::__cxx11::string::size();
  if (((1 < uVar2) && (pcVar3 = (char *)::std::__cxx11::string::front(), *pcVar3 == '(')) &&
     (pcVar3 = (char *)::std::__cxx11::string::back(), *pcVar3 == ')')) {
    __range1._4_4_ = 0;
    __end1._M_current = (char *)::std::__cxx11::string::begin();
    c = (char *)::std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&c), bVar1) {
      pcVar4 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1);
      local_40 = pcVar4;
      if (*pcVar4 == '(') {
        __range1._4_4_ = __range1._4_4_ + 1;
      }
      else if (((*pcVar4 == ')') && (__range1._4_4_ = __range1._4_4_ + -1, __range1._4_4_ == 0)) &&
              (pcVar5 = (reference)::std::__cxx11::string::back(), pcVar4 != pcVar5)) {
        return;
      }
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end1);
    }
    lVar6 = ::std::__cxx11::string::size();
    ::std::__cxx11::string::erase((ulong)expr,lVar6 - 1);
    local_50._M_current = (char *)::std::begin<std::__cxx11::string>(expr);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_48,&local_50);
    ::std::__cxx11::string::erase(expr,local_48);
  }
  return;
}

Assistant:

void CompilerGLSL::strip_enclosed_expression(string &expr)
{
	if (expr.size() < 2 || expr.front() != '(' || expr.back() != ')')
		return;

	// Have to make sure that our first and last parens actually enclose everything inside it.
	uint32_t paren_count = 0;
	for (auto &c : expr)
	{
		if (c == '(')
			paren_count++;
		else if (c == ')')
		{
			paren_count--;

			// If we hit 0 and this is not the final char, our first and final parens actually don't
			// enclose the expression, and we cannot strip, e.g.: (a + b) * (c + d).
			if (paren_count == 0 && &c != &expr.back())
				return;
		}
	}
	expr.erase(expr.size() - 1, 1);
	expr.erase(begin(expr));
}